

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmganalysis.cpp
# Opt level: O2

void __thiscall TPZMGAnalysis::SolveInternal<double>(TPZMGAnalysis *this)

{
  long lVar1;
  long *plVar2;
  TPZBaseMatrix *pTVar3;
  TPZMatrix<double> *pTVar4;
  int iVar5;
  undefined4 extraout_var;
  TPZFMatrix<double> *pTVar6;
  TPZFMatrix<double> *pTVar7;
  TPZSolutionMatrix *pTVar8;
  long lVar9;
  ostream *poVar10;
  TPZSolutionMatrix *pTVar11;
  STATE SVar12;
  double dVar13;
  TPZAutoPointer<TPZMatrix<double>_> local_168;
  double local_160;
  int64_t local_158;
  TPZFMatrix<double> residual;
  TPZFMatrix<double> delu;
  
  if ((this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fNElements
      != 1) {
    local_158 = TPZCompMesh::NEquations((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh)
    ;
    lVar9 = ((this->super_TPZLinearAnalysis).fRhs.fBaseMatrix)->fRow;
    if (lVar9 == (int)local_158) {
      pTVar11 = &(this->super_TPZLinearAnalysis).fRhs;
      lVar1 = (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
              super_TPZVec<TPZMatrixSolver<double>_*>.fNElements;
      pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(pTVar11);
      TPZFMatrix<double>::TPZFMatrix(&residual,pTVar6);
      local_168.fRef = (TPZReference *)0x0;
      TPZFMatrix<double>::TPZFMatrix(&delu,lVar9,1,(double *)&local_168);
      plVar2 = *(long **)((long)(this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
                                super_TPZVec<TPZMatrixSolver<double>_*>.fStore +
                         ((lVar1 << 0x20) + -0x100000000 >> 0x1d));
      pTVar8 = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution;
      pTVar3 = (this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fBaseMatrix;
      if (pTVar3->fRow == lVar9) {
        local_168.fRef = (TPZReference *)plVar2[0x14];
        LOCK();
        ((local_168.fRef)->fCounter).super___atomic_base<int>._M_i =
             ((local_168.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pTVar4 = (local_168.fRef)->fPointer;
        pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(pTVar8);
        pTVar7 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(pTVar11);
        (*(pTVar4->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])
                  (pTVar4,pTVar6,pTVar7,&residual);
        TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_168);
      }
      else {
        (*(pTVar3->super_TPZSavable)._vptr_TPZSavable[0xe])(pTVar3,lVar9,1);
      }
      SVar12 = Norm(pTVar11);
      local_160 = Norm(&residual);
      if (local_160 <= SVar12 * 1e-06) {
        std::operator<<((ostream *)&std::cout,
                        "TPZMGAnalysis::Solve no need for iterations normrhs = ");
        poVar10 = std::ostream::_M_insert<double>(SVar12);
        std::operator<<(poVar10," normres = ");
        poVar10 = std::ostream::_M_insert<double>(local_160);
        std::endl<char,std::char_traits<char>>(poVar10);
        lVar9 = (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
                super_TPZVec<TPZSolutionMatrix_*>.fNElements;
        if (lVar9 < (this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.
                    super_TPZVec<TPZCompMesh_*>.fNElements) {
          pTVar11 = (TPZSolutionMatrix *)operator_new(0x138);
          TPZSolutionMatrix::TPZSolutionMatrix(pTVar11,pTVar8);
          TPZStack<TPZSolutionMatrix_*,_10>::Push(&this->fSolutions,pTVar11);
        }
        else {
          TPZSolutionMatrix::operator=
                    (*(TPZSolutionMatrix **)
                      ((long)(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
                             super_TPZVec<TPZSolutionMatrix_*>.fStore +
                      ((lVar9 << 0x20) + -0x100000000 >> 0x1d)),pTVar8);
        }
      }
      else {
        if (plVar2 != (long *)0x0) {
          lVar9 = __dynamic_cast(plVar2,&TPZMatrixSolver<double>::typeinfo,
                                 &TPZStepSolver<double>::typeinfo,0);
          if (lVar9 != 0) {
            *(double *)(lVar9 + 200) = (SVar12 * 1e-06) / local_160;
          }
        }
        std::operator<<((ostream *)&std::cout,"TPZMGAnalysis::Run res : ");
        dVar13 = Norm(&residual);
        poVar10 = std::ostream::_M_insert<double>(dVar13);
        poVar10 = std::operator<<(poVar10," neq ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_158);
        std::endl<char,std::char_traits<char>>(poVar10);
        (**(code **)(*plVar2 + 0x58))(plVar2,&residual,&delu,0);
        pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(pTVar8);
        TPZFMatrix<double>::operator+=(pTVar6,&delu.super_TPZMatrix<double>);
        TPZCompMesh::LoadSolution
                  ((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh,pTVar8);
        lVar9 = (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
                super_TPZVec<TPZSolutionMatrix_*>.fNElements;
        if (lVar9 < (this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.
                    super_TPZVec<TPZCompMesh_*>.fNElements) {
          pTVar11 = (TPZSolutionMatrix *)operator_new(0x138);
          TPZSolutionMatrix::TPZSolutionMatrix(pTVar11,pTVar8);
          TPZStack<TPZSolutionMatrix_*,_10>::Push(&this->fSolutions,pTVar11);
        }
        else {
          TPZSolutionMatrix::operator=
                    (*(TPZSolutionMatrix **)
                      ((long)(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
                             super_TPZVec<TPZSolutionMatrix_*>.fStore +
                      ((lVar9 << 0x20) + -0x100000000 >> 0x1d)),pTVar8);
        }
      }
      TPZFMatrix<double>::~TPZFMatrix(&delu);
      TPZFMatrix<double>::~TPZFMatrix(&residual);
    }
    return;
  }
  TPZLinearAnalysis::Solve(&this->super_TPZLinearAnalysis);
  if ((this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
      super_TPZVec<TPZMatrixSolver<double>_*>.fNElements == 0) {
    iVar5 = (*(((this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolver)->super_TPZSavable).
              _vptr_TPZSavable[9])();
    TPZStack<TPZMatrixSolver<double>_*,_10>::Push
              (&this->fSolvers,(TPZMatrixSolver<double> *)CONCAT44(extraout_var,iVar5));
  }
  if ((this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
      super_TPZVec<TPZMatrixSolver<double>_*>.fNElements == 0) {
    TPZStack<TPZMatrixSolver<double>_*,_10>::Push
              (&this->fPrecondition,(TPZMatrixSolver<double> *)0x0);
  }
  lVar9 = (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
          super_TPZVec<TPZSolutionMatrix_*>.fNElements;
  if (lVar9 != 0) {
    TPZSolutionMatrix::operator=
              (*(TPZSolutionMatrix **)
                ((long)(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
                       super_TPZVec<TPZSolutionMatrix_*>.fStore +
                ((lVar9 << 0x20) + -0x100000000 >> 0x1d)),
               &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution);
    return;
  }
  pTVar8 = (TPZSolutionMatrix *)operator_new(0x138);
  TPZSolutionMatrix::TPZSolutionMatrix
            (pTVar8,&(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution);
  TPZStack<TPZSolutionMatrix_*,_10>::Push(&this->fSolutions,pTVar8);
  return;
}

Assistant:

void TPZMGAnalysis::SolveInternal()
{
  if(fMeshes.NElements() == 1) {
		TPZLinearAnalysis::Solve();
		if(fSolvers.NElements() == 0) {
			fSolvers.Push((TPZMatrixSolver<TVar> *) fSolver->Clone());
		}
		if(fPrecondition.NElements() == 0) {
			fPrecondition.Push(0);
		}
		if(fSolutions.NElements() == 0) {
			fSolutions.Push(new TPZSolutionMatrix(fSolution));
		} else {
			int nsol = fSolutions.NElements();
			*(fSolutions[nsol-1]) = fSolution;
		}
		return;
	}
	int numeq = fCompMesh->NEquations();
	if(fRhs.Rows() != numeq ) return;
	int nsolvers = fSolvers.NElements();
	
	TPZFMatrix<TVar> residual(fRhs);
	TPZFMatrix<TVar> delu(numeq,1,0.);
	TPZMatrixSolver<TVar> *solve = dynamic_cast<TPZMatrixSolver<TVar> *> (fSolvers[nsolvers-1]);
	if(fSolution.Rows() != numeq) {
		fSolution.Redim(numeq,1);
	} else {
		solve->Matrix()->Residual(fSolution,fRhs,residual);
	}
	
	REAL normrhs = Norm(fRhs);
	REAL normres  = Norm(residual);
	if(normrhs*1.e-6 >= normres) {
		cout << "TPZMGAnalysis::Solve no need for iterations normrhs = " << normrhs << " normres = " << normres << endl;
		if(fSolutions.NElements() < fMeshes.NElements()) {
			fSolutions.Push(new TPZSolutionMatrix(fSolution));
		} else {
			int nsol = fSolutions.NElements();
			*(fSolutions[nsol-1]) = fSolution;
		}
		return ;
	}
	
	TPZStepSolver<TVar> *stepsolve = dynamic_cast<TPZStepSolver<TVar> *> (solve);
	if(stepsolve) stepsolve->SetTolerance(1.e-6*normrhs/normres);
	cout << "TPZMGAnalysis::Run res : " << Norm(residual) << " neq " << numeq << endl;
	solve->Solve(residual, delu);
	TPZFMatrix<TVar> &mysol = fSolution;
	mysol += delu;

	fCompMesh->LoadSolution(fSolution);
	if(fSolutions.NElements() < fMeshes.NElements()) {
		fSolutions.Push(new TPZSolutionMatrix(fSolution));
	} else {
		int nsol = fSolutions.NElements();
		*(fSolutions[nsol-1]) = fSolution;
	}
}